

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::Object::Object
          (Object *this,char *type,SharedPtr<tcu::ThreadUtil::Event> *e,
          SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *sync)

{
  SharedPtr<tcu::ThreadUtil::Event> local_38;
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *local_28;
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *sync_local;
  SharedPtr<tcu::ThreadUtil::Event> *e_local;
  char *type_local;
  Object *this_local;
  
  local_28 = sync;
  sync_local = (SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *)e;
  e_local = (SharedPtr<tcu::ThreadUtil::Event> *)type;
  type_local = (char *)this;
  de::SharedPtr<tcu::ThreadUtil::Event>::SharedPtr(&local_38,e);
  tcu::ThreadUtil::Object::Object(&this->super_Object,type,&local_38);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_38);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Object_03267480;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::SharedPtr(&this->m_modifySync,sync);
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ::vector(&this->m_readSyncs);
  return;
}

Assistant:

Object::Object (const char* type, SharedPtr<tcu::ThreadUtil::Event> e, SharedPtr<FenceSync> sync)
	: tcu::ThreadUtil::Object	(type, e)
	, m_modifySync				(sync)
{
}